

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputfile.cpp
# Opt level: O1

int __thiscall OutputFile::initWriter(OutputFile *this)

{
  ofstream *poVar1;
  pointer ppLVar2;
  Network *pNVar3;
  char cVar4;
  int iVar5;
  pointer ppLVar6;
  int iVar7;
  undefined8 uStack_88;
  int sysBuf [21];
  
  cVar4 = std::__basic_file<char>::is_open();
  iVar5 = 0;
  if ((cVar4 != '\0') && (iVar5 = 0, this->network != (Network *)0x0)) {
    poVar1 = &this->fwriter;
    std::ofstream::close();
    std::ifstream::close();
    std::ofstream::open((char *)poVar1,(_Ios_Openmode)(this->fname)._M_dataplus._M_p);
    cVar4 = std::__basic_file<char>::is_open();
    iVar5 = 3;
    if (cVar4 != '\0') {
      iVar7 = 0;
      iVar5 = Network::count(this->network,NODE);
      this->nodeCount = iVar5;
      iVar5 = Network::count(this->network,LINK);
      this->linkCount = iVar5;
      ppLVar6 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppLVar2 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppLVar6 != ppLVar2) {
        iVar7 = 0;
        do {
          iVar5 = (*((*ppLVar6)->super_Element)._vptr_Element[2])();
          iVar7 = iVar7 + (uint)(iVar5 == 1);
          ppLVar6 = ppLVar6 + 1;
        } while (ppLVar6 != ppLVar2);
      }
      this->pumpCount = iVar7;
      this->timePeriodCount = 0;
      pNVar3 = this->network;
      sysBuf[0xe] = (pNVar3->options).timeOptions[6];
      this->reportStart = sysBuf[0xe];
      sysBuf[0xf] = (pNVar3->options).timeOptions[5];
      this->reportStep = sysBuf[0xf];
      this->energyResultsOffset = 0x54;
      sysBuf[3] = iVar7 * 0x1c + 0x58;
      this->networkResultsOffset = sysBuf[3];
      uStack_88 = 0x753049b1beb5;
      sysBuf[0] = 0;
      sysBuf[1] = 0;
      sysBuf[2] = 0x54;
      sysBuf[4] = this->nodeCount;
      sysBuf[5] = this->linkCount;
      sysBuf[7] = (pNVar3->options).indexOptions[8];
      sysBuf[8] = (pNVar3->options).indexOptions[10];
      sysBuf[9] = (pNVar3->options).indexOptions[0];
      sysBuf[10] = (pNVar3->options).indexOptions[1];
      sysBuf[0xb] = (pNVar3->options).indexOptions[2];
      sysBuf[0xc] = (pNVar3->options).indexOptions[9];
      sysBuf[0xd] = (pNVar3->options).timeOptions[9];
      sysBuf[0x10] = 6;
      sysBuf[0x11] = 7;
      sysBuf[0x12] = 6;
      sysBuf[6] = iVar7;
      std::ostream::write((char *)poVar1,(long)&uStack_88);
      iVar5 = 7;
      if (((&this->field_0x40)[*(long *)(*(long *)&this->fwriter + -0x18)] & 5) == 0) {
        iVar5 = 0;
        std::ostream::seekp(poVar1,(long)this->networkResultsOffset,0);
      }
    }
  }
  return iVar5;
}

Assistant:

int OutputFile::initWriter()
{
    // ... return if output file not previously opened
    if ( !fwriter.is_open() || !network ) return 0;

    // ... re-open the output file
    fwriter.close();
    freader.close();
    fwriter.open(fname.c_str(), ios::out | ios::binary | ios::trunc);
    if ( !fwriter.is_open() ) return FileError::CANNOT_OPEN_OUTPUT_FILE;

    // ... retrieve element counts
    nodeCount = network->count(Element::NODE);
    linkCount = network->count(Element::LINK);
    pumpCount = findPumpCount(network);

    // ... retrieve reporting time steps
    timePeriodCount = 0;
    reportStart = network->option(Options::REPORT_START);
    reportStep = network->option(Options::REPORT_STEP);

    // ... compute byte offsets for where energy results and network results begin
    energyResultsOffset = NumSysVars * IntSize;
    networkResultsOffset = energyResultsOffset + pumpCount *
                           (IntSize + NumPumpVars * FloatSize) + FloatSize;

    // ... write system info to the output file
    int sysBuf[NumSysVars];
    sysBuf[0] = MAGICNUMBER;
    sysBuf[1] = VERSION;
    sysBuf[2] = 0;                     // reserved for error code
    sysBuf[3] = 0;                     // reserved for warning flag
    sysBuf[4] = energyResultsOffset;
    sysBuf[5] = networkResultsOffset;
    sysBuf[6] = nodeCount;
    sysBuf[7] = linkCount;
    sysBuf[8] = pumpCount;
    sysBuf[9] = network->option(Options::QUAL_TYPE);
    sysBuf[10] = network->option(Options::TRACE_NODE);
    sysBuf[11] = network->option(Options::UNIT_SYSTEM);
    sysBuf[12] = network->option(Options::FLOW_UNITS);
    sysBuf[13] = network->option(Options::PRESSURE_UNITS);
    sysBuf[14] = network->option(Options::QUAL_UNITS);
    sysBuf[15] = network->option(Options::REPORT_STATISTIC);
    sysBuf[16] = reportStart;
    sysBuf[17] = reportStep;
    sysBuf[18] = NumNodeVars;
    sysBuf[19] = NumLinkVars;
    sysBuf[20] = NumPumpVars;
    fwriter.write((char *)sysBuf, sizeof(sysBuf));
    if ( fwriter.fail() ) return FileError::CANNOT_WRITE_TO_OUTPUT_FILE;

    // ... position the file to where network results begins
    fwriter.seekp(networkResultsOffset);
    return 0;
}